

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::markDirty<QRect>
          (QWidgetRepaintManager *this,QRect *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  bool bVar1;
  byte bVar2;
  QDebug *pQVar3;
  QWidgetPrivate *pQVar4;
  ulong uVar5;
  int in_ECX;
  QWidgetRepaintManager *in_RDX;
  QRect *in_RSI;
  QWidget *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool eventAlreadyPosted_1;
  bool eventAlreadyPosted;
  QRect translatedRect;
  QPoint offset;
  QRect effectiveWidgetRect;
  QRect widgetRect;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QWidgetPrivate *in_stack_fffffffffffffe58;
  QRect *in_stack_fffffffffffffe60;
  QWidget *in_stack_fffffffffffffe68;
  QWidgetPrivate *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  QPaintDevice QVar6;
  undefined8 in_stack_fffffffffffffe80;
  QWidgetRepaintManager *this_00;
  QDebug *in_stack_fffffffffffffe88;
  QPoint *in_stack_fffffffffffffe90;
  UpdateTime UVar7;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  QRegion local_138;
  undefined1 local_130 [8];
  QRegion in_stack_fffffffffffffee0;
  QRect local_118;
  QRect local_108;
  QRect local_f8;
  QSize local_e8;
  QRect local_c8;
  undefined1 local_b8 [24];
  QPoint local_a0;
  undefined1 local_98 [16];
  QRegion local_88;
  undefined1 local_80 [48];
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetPainting();
  anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffe60,
             (QLoggingCategory *)in_stack_fffffffffffffe58);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3abd44);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
               (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(char *)in_stack_fffffffffffffe58,
               (char *)0x3abd5d);
    QMessageLogger::info();
    pQVar3 = QDebug::operator<<((QDebug *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (char *)CONCAT44(in_ECX,in_R8D));
    QDebug::QDebug(&local_48,pQVar3);
    ::operator<<((QDebug *)&local_40,(QRect *)&local_48);
    pQVar3 = QDebug::operator<<((QDebug *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (char *)CONCAT44(in_ECX,in_R8D));
    QDebug::QDebug(&local_38,pQVar3);
    ::operator<<((QDebug *)in_stack_fffffffffffffee0.d,local_130._8_8_);
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                       (char *)CONCAT44(in_ECX,in_R8D));
    pQVar3 = QDebug::operator<<((QDebug *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (char *)CONCAT44(in_ECX,in_R8D));
    QDebug::QDebug(&local_28,pQVar3);
    ::operator<<(in_stack_fffffffffffffe88,(UpdateTime)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    local_10 = 0;
  }
  QWidget::d_func((QWidget *)0x3abeac);
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(in_stack_fffffffffffffe70);
  local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._0_16_ =
       (undefined1  [16])widgetRectFor(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  QWidget::d_func((QWidget *)0x3abefb);
  bVar1 = QWidgetPrivate::shouldPaintOnScreen(in_stack_fffffffffffffe58);
  if (bVar1) {
    QWidget::d_func((QWidget *)0x3abf16);
    UVar7 = (UpdateTime)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    uVar5 = QRegion::isEmpty();
    if ((uVar5 & 1) == 0) {
      pQVar4 = QWidget::d_func((QWidget *)0x3abf8f);
      uVar5 = qt_region_strictContains((QRegion *)&pQVar4->dirty,(QRect *)local_80);
      if ((uVar5 & 1) == 0) {
        QWidget::d_func((QWidget *)0x3abfd7);
        bVar2 = QRegion::isEmpty();
        bVar2 = (bVar2 ^ 0xff) & 1;
        pQVar4 = QWidget::d_func((QWidget *)0x3ac002);
        QRegion::operator+=(&pQVar4->dirty,in_RSI);
        if (((bVar2 & 1) == 0) || (in_ECX == 0)) {
          sendUpdateRequest((QWidgetRepaintManager *)
                            CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffea6,
                                                    in_stack_fffffffffffffea0)),in_RDI,
                            (UpdateTime)((ulong)in_RSI >> 0x20));
        }
      }
      else if (in_ECX == 0) {
        sendUpdateRequest((QWidgetRepaintManager *)
                          CONCAT17(in_stack_fffffffffffffea7,
                                   CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                          in_RDI,UVar7);
      }
    }
    else {
      QRegion::QRegion(&local_88,in_RSI,Rectangle);
      QWidget::d_func((QWidget *)0x3abf49);
      QRegion::operator=((QRegion *)in_stack_fffffffffffffe60,(QRegion *)in_stack_fffffffffffffe58);
      QRegion::~QRegion(&local_88);
      sendUpdateRequest((QWidgetRepaintManager *)
                        CONCAT17(in_stack_fffffffffffffea7,
                                 CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                        in_RDI,UVar7);
    }
  }
  else {
    pQVar4 = QWidgetPrivate::get((QWidget *)0x3ac046);
    if ((*(uint *)&pQVar4->field_0x250 >> 0x18 & 1) == 0) {
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QWidget::d_func((QWidget *)0x3ac0d4);
      local_98 = (undefined1  [16])
                 QWidgetPrivate::effectiveRectFor
                           ((QWidgetPrivate *)
                            CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                            (QRect *)in_stack_fffffffffffffe70);
      local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      this_00 = in_RDX;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe60);
      local_a0 = QWidget::mapTo((QWidget *)this_00,
                                (QWidget *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (QPoint *)in_stack_fffffffffffffe70);
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_16_ =
           (undefined1  [16])QRect::translated((QRect *)in_RDI,in_stack_fffffffffffffe90);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe60);
      local_e8 = QWidget::size((QWidget *)in_stack_fffffffffffffe58);
      QRect::QRect((QRect *)this_00,
                   (QPoint *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                   (QSize *)in_stack_fffffffffffffe70);
      local_c8 = QRect::intersected(in_stack_fffffffffffffe60,(QRect *)in_stack_fffffffffffffe58);
      local_b8._0_16_ = (undefined1  [16])local_c8;
      uVar5 = qt_region_strictContains((QRegion *)&in_RDI->super_QPaintDevice,(QRect *)local_b8);
      if ((uVar5 & 1) == 0) {
        if (in_R8D == 1) {
          bVar2 = QRegion::isEmpty();
          QVar6 = (QPaintDevice)0x1;
          if ((bVar2 & 1) != 0) {
            QVar6 = in_RDI[3].super_QPaintDevice;
          }
          bVar2 = (byte)QVar6 & 1;
          pQVar4 = QWidget::d_func((QWidget *)0x3ac294);
          if (pQVar4->graphicsEffect == (QGraphicsEffect *)0x0) {
            local_118 = QRect::translated((QRect *)in_RDI,in_stack_fffffffffffffe90);
            UVar7 = (UpdateTime)((ulong)in_stack_fffffffffffffe90 >> 0x20);
            QRegion::operator+=((QRegion *)&in_RDI->super_QPaintDevice,(QRect *)&local_118);
          }
          else {
            QWidget::d_func((QWidget *)0x3ac2a8);
            local_108 = QWidgetPrivate::effectiveRectFor
                                  ((QWidgetPrivate *)CONCAT17(QVar6,in_stack_fffffffffffffe78),
                                   (QRect *)in_stack_fffffffffffffe70);
            local_f8 = QRect::translated((QRect *)in_RDI,in_stack_fffffffffffffe90);
            UVar7 = (UpdateTime)((ulong)in_stack_fffffffffffffe90 >> 0x20);
            QRegion::operator+=((QRegion *)&in_RDI->super_QPaintDevice,(QRect *)&local_f8);
          }
          if (((bVar2 & 1) == 0) || (in_ECX == 0)) {
            sendUpdateRequest((QWidgetRepaintManager *)
                              CONCAT17(in_stack_fffffffffffffea7,
                                       CONCAT16(bVar2,in_stack_fffffffffffffea0)),in_RDI,UVar7);
          }
        }
        else {
          bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x3ac36c);
          UVar7 = (UpdateTime)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          if (bVar1) {
            QRegion::QRegion((QRegion *)&stack0xfffffffffffffee0,in_RSI,Rectangle);
            addDirtyWidget(this_00,(QWidget *)
                                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                           (QRegion *)in_RDX);
            QRegion::~QRegion((QRegion *)&stack0xfffffffffffffee0);
            sendUpdateRequest((QWidgetRepaintManager *)
                              CONCAT17(in_stack_fffffffffffffea7,
                                       CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)
                                      ),in_RDI,UVar7);
          }
          else {
            pQVar4 = QWidget::d_func((QWidget *)0x3ac3d4);
            if ((*(uint *)&pQVar4->field_0x250 >> 0x13 & 1) == 0) {
              QRegion::QRegion(&local_138,in_RSI,Rectangle);
              addDirtyWidget(this_00,(QWidget *)
                                     CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                             (QRegion *)in_stack_fffffffffffffe70);
              QRegion::~QRegion(&local_138);
            }
            else {
              pQVar4 = QWidget::d_func((QWidget *)0x3ac3f3);
              uVar5 = qt_region_strictContains((QRegion *)&pQVar4->dirty,(QRect *)local_98);
              if ((uVar5 & 1) == 0) {
                pQVar4 = QWidget::d_func((QWidget *)0x3ac41c);
                if (pQVar4->graphicsEffect == (QGraphicsEffect *)0x0) {
                  pQVar4 = QWidget::d_func((QWidget *)0x3ac47e);
                  QRegion::operator+=(&pQVar4->dirty,in_RSI);
                }
                else {
                  QWidget::d_func((QWidget *)0x3ac430);
                  _local_130 = QWidgetPrivate::effectiveRectFor
                                         ((QWidgetPrivate *)
                                          CONCAT17(in_stack_fffffffffffffe7f,
                                                   in_stack_fffffffffffffe78),
                                          (QRect *)in_stack_fffffffffffffe70);
                  pQVar4 = QWidget::d_func((QWidget *)0x3ac454);
                  QRegion::operator+=(&pQVar4->dirty,(QRect *)local_130);
                }
              }
            }
            if (in_ECX == 0) {
              sendUpdateRequest((QWidgetRepaintManager *)
                                CONCAT17(in_stack_fffffffffffffea7,
                                         CONCAT16(in_stack_fffffffffffffea6,
                                                  in_stack_fffffffffffffea0)),in_RDI,UVar7);
            }
          }
        }
      }
      else if (in_ECX == 0) {
        sendUpdateRequest((QWidgetRepaintManager *)
                          CONCAT17(in_stack_fffffffffffffea7,
                                   CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                          in_RDI,(UpdateTime)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      }
    }
    else {
      pQVar4 = QWidget::d_func((QWidget *)0x3ac061);
      UVar7 = (UpdateTime)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      if ((*(uint *)&pQVar4->field_0x250 >> 0x13 & 1) == 0) {
        addDirtyRenderToTextureWidget
                  ((QWidgetRepaintManager *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
      if ((((byte)in_RDI[3].super_QPaintDevice & 1) == 0) || (in_ECX == 0)) {
        sendUpdateRequest((QWidgetRepaintManager *)
                          CONCAT17(in_stack_fffffffffffffea7,
                                   CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                          in_RDI,UVar7);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}